

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNativeStandardFile.cpp
# Opt level: O3

void __thiscall
chatra::emb::io::WriteStandardFile::WriteStandardFile
          (WriteStandardFile *this,string *fileName,Type_conflict flags,FILE *fp,size_t length,
          bool append)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  FILE *__stream;
  int iVar3;
  ulong *puVar4;
  ulong local_20;
  undefined8 uStack_18;
  
  puVar4 = (ulong *)(fileName->_M_dataplus)._M_p;
  paVar1 = &fileName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar4 == paVar1) {
    local_20 = paVar1->_M_allocated_capacity;
    uStack_18 = *(undefined8 *)((long)&fileName->field_2 + 8);
    puVar4 = &local_20;
  }
  else {
    local_20 = paVar1->_M_allocated_capacity;
  }
  sVar2 = fileName->_M_string_length;
  (fileName->_M_dataplus)._M_p = (pointer)paVar1;
  fileName->_M_string_length = 0;
  (fileName->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->super_StandardFileCommon).fileName.field_2;
  (this->super_StandardFileCommon).fileName._M_dataplus._M_p = (pointer)paVar1;
  if (puVar4 == &local_20) {
    paVar1->_M_allocated_capacity = local_20;
    *(undefined8 *)((long)&(this->super_StandardFileCommon).fileName.field_2 + 8) = uStack_18;
  }
  else {
    (this->super_StandardFileCommon).fileName._M_dataplus._M_p = (pointer)puVar4;
    (this->super_StandardFileCommon).fileName.field_2._M_allocated_capacity = local_20;
  }
  (this->super_StandardFileCommon).fileName._M_string_length = sVar2;
  local_20 = local_20 & 0xffffffffffffff00;
  (this->super_StandardFileCommon).flags = flags;
  (this->super_StandardFileCommon).fp = fp;
  (this->super_StandardFileCommon).length = length;
  (this->super_StandardFileCommon).current = 0;
  (this->super_StandardFileCommon).super_IFile._vptr_IFile =
       (_func_int **)&PTR__StandardFileCommon_00247c00;
  if (append) {
    (this->super_StandardFileCommon).current = length;
    iVar3 = fseek((FILE *)fp,length,0);
    if (iVar3 != 0) {
      __stream = (FILE *)(this->super_StandardFileCommon).fp;
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      (this->super_StandardFileCommon).fp = (FILE *)0x0;
    }
  }
  return;
}

Assistant:

WriteStandardFile(std::string fileName, FileOpenFlags::Type flags,
			std::FILE* fp, size_t length, bool append) : StandardFileCommon(std::move(fileName), flags, fp, length) {
		if (append) {
			current = length;
			if (std::fseek(fp, static_cast<long>(length), SEEK_SET))
				doClose();
		}
	}